

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O0

nametree_entry_t * ndn_nametree_find(ndn_nametree_t *nametree,uint8_t *name,size_t len)

{
  ushort uVar1;
  ulong uVar2;
  size_t local_58;
  ulong local_50;
  size_t offset;
  size_t eqiv_component_len;
  size_t component_len;
  int local_30;
  int tmp;
  int father;
  int now_node;
  size_t len_local;
  uint8_t *name_local;
  ndn_nametree_t *nametree_local;
  
  local_30 = 0;
  if (len < 2) {
    nametree_local = (ndn_nametree_t *)0x0;
  }
  else {
    if (name[1] < 0xfd) {
      local_50 = 2;
    }
    else {
      local_50 = 4;
    }
    for (; local_50 < len; local_50 = uVar2 + local_50) {
      uVar2 = (ulong)(int)(name[local_50 + 1] + 2);
      local_58 = uVar2;
      if (0x23 < uVar2) {
        local_58 = 0x24;
      }
      uVar1 = *(ushort *)(nametree + (long)local_30 * 0x2e + 0x26);
      component_len._4_4_ = -2;
      while ((tmp = (int)uVar1, tmp != 0xffff &&
             (component_len._4_4_ = memcmp(name + local_50,nametree + (long)tmp * 0x2e,local_58),
             0 < component_len._4_4_))) {
        uVar1 = *(ushort *)(nametree + (long)tmp * 0x2e + 0x28);
      }
      if (component_len._4_4_ != 0) {
        return (nametree_entry_t *)0x0;
      }
      local_30 = tmp;
    }
    nametree_local = nametree + (long)local_30 * 0x2e;
  }
  return (nametree_entry_t *)nametree_local;
}

Assistant:

nametree_entry_t*
ndn_nametree_find(ndn_nametree_t *nametree, uint8_t name[], size_t len)
{
  int now_node, father = 0 , tmp;
  size_t component_len, eqiv_component_len, offset = 0;
  // TODO: Put it into decoder
  if (len < 2) return NULL;
  if (name[1] < 253) offset = 2; else offset = 4;
  while (offset < len) {
    component_len = name[offset + 1] + 2;
    eqiv_component_len = minof2(component_len, NDN_NAME_COMPONENT_BUFFER_SIZE);
    now_node = (*nametree)[father].left_child;
    tmp = -2;
    while (now_node != NDN_INVALID_ID) {
      tmp = memcmp(name+offset, (*nametree)[now_node].val , eqiv_component_len);
      if (tmp <= 0) break;
      now_node = (*nametree)[now_node].right_bro;
    }
    if (tmp != 0) {
      return NULL;
    }
    offset += component_len;
    father = now_node;
  }
  return &(*nametree)[father];
}